

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O0

bool __thiscall QBoxLayout::setStretchFactor(QBoxLayout *this,QWidget *widget,int stretch)

{
  QBoxLayoutItem *pQVar1;
  int iVar2;
  QBoxLayoutPrivate *pQVar3;
  long i_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  undefined4 extraout_var;
  int in_EDX;
  long in_RSI;
  QList<QBoxLayoutItem_*> *in_RDI;
  QBoxLayoutItem *box;
  int i;
  QBoxLayoutPrivate *d;
  int local_2c;
  
  pQVar3 = d_func((QBoxLayout *)0x2f5a25);
  if (in_RSI != 0) {
    local_2c = 0;
    while( true ) {
      i_00 = (long)local_2c;
      qVar4 = QList<QBoxLayoutItem_*>::size(&pQVar3->list);
      if (qVar4 <= i_00) break;
      ppQVar5 = QList<QBoxLayoutItem_*>::at(in_RDI,i_00);
      pQVar1 = *ppQVar5;
      iVar2 = (*pQVar1->item->_vptr_QLayoutItem[0xd])();
      if (CONCAT44(extraout_var,iVar2) == in_RSI) {
        pQVar1->stretch = in_EDX;
        (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
        return true;
      }
      local_2c = local_2c + 1;
    }
  }
  return false;
}

Assistant:

bool QBoxLayout::setStretchFactor(QWidget *widget, int stretch)
{
    Q_D(QBoxLayout);
    if (!widget)
        return false;
    for (int i = 0; i < d->list.size(); ++i) {
        QBoxLayoutItem *box = d->list.at(i);
        if (box->item->widget() == widget) {
            box->stretch = stretch;
            invalidate();
            return true;
        }
    }
    return false;
}